

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O3

string * __thiscall
duckdb::PhysicalOperator::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PhysicalOperator *this,ExplainFormat format)

{
  pointer this_00;
  type root;
  pointer *__ptr;
  stringstream ss;
  undefined1 local_1a8 [32];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  TreeRenderer::CreateRenderer((TreeRenderer *)(local_1a8 + 8),format);
  ::std::__cxx11::stringstream::stringstream((stringstream *)(local_1a8 + 0x10));
  RenderTree::CreateRenderTree((RenderTree *)local_1a8,this);
  this_00 = unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>,_true>::
            operator->((unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>,_true>
                        *)(local_1a8 + 8));
  root = unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>::operator*
                   ((unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> *
                    )local_1a8);
  TreeRenderer::ToStream(this_00,root,local_188);
  ::std::__cxx11::stringbuf::str();
  if ((__uniq_ptr_data<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>,_std::default_delete<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>[]>,_true,_true>
       )local_1a8._0_8_ !=
      (tuple<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>_*,_std::default_delete<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>[]>_>
       )0x0) {
    ::std::default_delete<duckdb::RenderTree>::operator()
              ((default_delete<duckdb::RenderTree> *)local_1a8,(RenderTree *)local_1a8._0_8_);
  }
  ::std::__cxx11::stringstream::~stringstream((stringstream *)(local_1a8 + 0x10));
  ::std::ios_base::~ios_base(local_118);
  if ((long *)local_1a8._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_1a8._8_8_ + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

string PhysicalOperator::ToString(ExplainFormat format) const {
	auto renderer = TreeRenderer::CreateRenderer(format);
	stringstream ss;
	auto tree = RenderTree::CreateRenderTree(*this);
	renderer->ToStream(*tree, ss);
	return ss.str();
}